

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O3

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<float>::iuCsvFileParamsGenerator
          (iuCsvFileParamsGenerator<float> *this,string *path,char delimiter)

{
  params_t local_30;
  
  (this->super_iuValuesInParamsGenerator<float>).super_iuIParamGenerator<int>.
  _vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_0013e8c0;
  ReadParams(&local_30,this,path,delimiter);
  (this->super_iuValuesInParamsGenerator<float>).super_iuIParamGenerator<int>.
  _vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_0013e940;
  std::vector<float,_std::allocator<float>_>::vector
            (&(this->super_iuValuesInParamsGenerator<float>).m_values,&local_30);
  (this->super_iuValuesInParamsGenerator<float>).m_it._M_current = (float *)0x0;
  if (local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (this->super_iuValuesInParamsGenerator<float>).super_iuIParamGenerator<int>.
  _vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_0013e8c0;
  return;
}

Assistant:

explicit iuCsvFileParamsGenerator(const ::std::string& path, char delimiter = ',')
        : iuValuesInParamsGenerator<T>(ReadParams(path, delimiter))
    {
    }